

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QCss::BasicSelector>::emplace<QCss::BasicSelector_const&>
          (QMovableArrayOps<QCss::BasicSelector> *this,qsizetype i,BasicSelector *args)

{
  BasicSelector **ppBVar1;
  qsizetype *pqVar2;
  long lVar3;
  Data *pDVar4;
  qsizetype qVar5;
  long in_FS_OFFSET;
  bool bVar6;
  Inserter local_c0;
  BasicSelector tmp;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = (this->super_QGenericArrayOps<QCss::BasicSelector>).
           super_QArrayDataPointer<QCss::BasicSelector>.d;
  if ((pDVar4 != (Data *)0x0) &&
     ((__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> < 2)) {
    if ((this->super_QGenericArrayOps<QCss::BasicSelector>).
        super_QArrayDataPointer<QCss::BasicSelector>.size == i) {
      qVar5 = QArrayDataPointer<QCss::BasicSelector>::freeSpaceAtEnd
                        ((QArrayDataPointer<QCss::BasicSelector> *)this);
      if (qVar5 == 0) goto LAB_00367e25;
      QCss::BasicSelector::BasicSelector
                ((this->super_QGenericArrayOps<QCss::BasicSelector>).
                 super_QArrayDataPointer<QCss::BasicSelector>.ptr +
                 (this->super_QGenericArrayOps<QCss::BasicSelector>).
                 super_QArrayDataPointer<QCss::BasicSelector>.size,args);
LAB_00367f34:
      pqVar2 = &(this->super_QGenericArrayOps<QCss::BasicSelector>).
                super_QArrayDataPointer<QCss::BasicSelector>.size;
      *pqVar2 = *pqVar2 + 1;
      goto LAB_00367eed;
    }
LAB_00367e25:
    if (i == 0) {
      qVar5 = QArrayDataPointer<QCss::BasicSelector>::freeSpaceAtBegin
                        ((QArrayDataPointer<QCss::BasicSelector> *)this);
      if (qVar5 != 0) {
        QCss::BasicSelector::BasicSelector
                  ((this->super_QGenericArrayOps<QCss::BasicSelector>).
                   super_QArrayDataPointer<QCss::BasicSelector>.ptr + -1,args);
        ppBVar1 = &(this->super_QGenericArrayOps<QCss::BasicSelector>).
                   super_QArrayDataPointer<QCss::BasicSelector>.ptr;
        *ppBVar1 = *ppBVar1 + -1;
        goto LAB_00367f34;
      }
    }
  }
  tmp._96_8_ = &DAT_aaaaaaaaaaaaaaaa;
  tmp.attributeSelectors.d.ptr = (AttributeSelector *)&DAT_aaaaaaaaaaaaaaaa;
  tmp.attributeSelectors.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  tmp.pseudos.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  tmp.attributeSelectors.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  tmp.pseudos.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  tmp.pseudos.d.ptr = (Pseudo *)&DAT_aaaaaaaaaaaaaaaa;
  tmp.ids.d.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  tmp.ids.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  tmp.elementName.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  tmp.ids.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  tmp.elementName.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  tmp.elementName.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QCss::BasicSelector::BasicSelector(&tmp,args);
  bVar6 = (this->super_QGenericArrayOps<QCss::BasicSelector>).
          super_QArrayDataPointer<QCss::BasicSelector>.size != 0;
  QArrayDataPointer<QCss::BasicSelector>::detachAndGrow
            ((QArrayDataPointer<QCss::BasicSelector> *)this,(uint)(i == 0 && bVar6),1,
             (BasicSelector **)0x0,(QArrayDataPointer<QCss::BasicSelector> *)0x0);
  if (i == 0 && bVar6) {
    QCss::BasicSelector::BasicSelector
              ((this->super_QGenericArrayOps<QCss::BasicSelector>).
               super_QArrayDataPointer<QCss::BasicSelector>.ptr + -1,&tmp);
    ppBVar1 = &(this->super_QGenericArrayOps<QCss::BasicSelector>).
               super_QArrayDataPointer<QCss::BasicSelector>.ptr;
    *ppBVar1 = *ppBVar1 + -1;
    pqVar2 = &(this->super_QGenericArrayOps<QCss::BasicSelector>).
              super_QArrayDataPointer<QCss::BasicSelector>.size;
    *pqVar2 = *pqVar2 + 1;
  }
  else {
    Inserter::Inserter(&local_c0,(QArrayDataPointer<QCss::BasicSelector> *)this,i,1);
    QCss::BasicSelector::BasicSelector(local_c0.displaceFrom,&tmp);
    local_c0.displaceFrom = local_c0.displaceFrom + 1;
    (local_c0.data)->size = (local_c0.data)->size + local_c0.nInserts;
  }
  QCss::BasicSelector::~BasicSelector(&tmp);
LAB_00367eed:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }